

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

void Gia_ObjComputeTruthTableStart(Gia_Man_t *p,int nVarsMax)

{
  undefined4 uVar1;
  void *pvVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  void **ppvVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Wrd_t *pVVar9;
  word *__s;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (p->vTtMemory != (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vTtMemory == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                  ,0x14a,"void Gia_ObjComputeTruthTableStart(Gia_Man_t *, int)");
  }
  p->nTtVars = nVarsMax;
  iVar3 = 1 << ((char)nVarsMax - 6U & 0x1f);
  if (nVarsMax < 7) {
    iVar3 = 1;
  }
  p->nTtWords = iVar3;
  uVar14 = 6;
  if (6 < nVarsMax) {
    uVar14 = (ulong)(uint)nVarsMax;
  }
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x400);
  pVVar4->pArray = piVar5;
  p->vTtNodes = pVVar4;
  iVar3 = (int)uVar14;
  iVar11 = iVar3 + -5;
  uVar13 = 1 << ((byte)iVar11 & 0x1f);
  ppvVar6 = (void **)malloc(((long)(int)uVar13 * 4 + 8) * uVar14);
  lVar7 = uVar14 * 8;
  uVar10 = 0;
  do {
    ppvVar6[uVar10] = (void *)((long)ppvVar6 + lVar7);
    uVar10 = uVar10 + 1;
    lVar7 = lVar7 + (long)(int)uVar13 * 4;
  } while (uVar14 != uVar10);
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nSize = iVar3;
  pVVar8->nCap = iVar3;
  pVVar8->pArray = ppvVar6;
  uVar10 = 0;
  do {
    pvVar2 = ppvVar6[uVar10];
    if (uVar10 < 5) {
      if (iVar11 != 0x1f) {
        uVar1 = (&DAT_00991cd0)[uVar10];
        uVar12 = 0;
        do {
          *(undefined4 *)((long)pvVar2 + uVar12 * 4) = uVar1;
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
    }
    else if (iVar11 != 0x1f) {
      uVar12 = 0;
      do {
        *(uint *)((long)pvVar2 + uVar12 * 4) =
             -(uint)((1 << ((char)uVar10 - 5U & 0x1f) & (uint)uVar12) != 0);
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != uVar14);
  p->vTtInputs = pVVar8;
  lVar7 = (long)p->nTtWords;
  pVVar9 = (Vec_Wrd_t *)malloc(0x10);
  pVVar9->nSize = 0;
  iVar3 = (int)(lVar7 << 6);
  pVVar9->nCap = iVar3;
  if (lVar7 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc(lVar7 << 9);
  }
  pVVar9->pArray = __s;
  pVVar9->nSize = iVar3;
  piVar5 = (int *)0x0;
  memset(__s,0,(long)iVar3 << 3);
  p->vTtMemory = pVVar9;
  iVar3 = p->nObjs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar13 = 0x10;
  if (0xe < iVar3 + 999U) {
    uVar13 = iVar3 + 1000;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar13;
  if (uVar13 != 0) {
    piVar5 = (int *)malloc((long)(int)uVar13 << 2);
  }
  pVVar4->pArray = piVar5;
  p->vTtNums = pVVar4;
  if (0 < (int)uVar13) {
    piVar5 = pVVar4->pArray;
    uVar14 = 0;
    do {
      piVar5[uVar14] = -1000000000;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  pVVar4->nSize = uVar13;
  return;
}

Assistant:

void Gia_ObjComputeTruthTableStart( Gia_Man_t * p, int nVarsMax )
{
    assert( p->vTtMemory == NULL );
    p->nTtVars   = nVarsMax;
    p->nTtWords  = Abc_Truth6WordNum( p->nTtVars );
    p->vTtNodes  = Vec_IntAlloc( 256 );
    p->vTtInputs = Vec_PtrAllocTruthTables( Abc_MaxInt(6, p->nTtVars) );
    p->vTtMemory = Vec_WrdStart( p->nTtWords * 64 );
    p->vTtNums   = Vec_IntAlloc( Gia_ManObjNum(p) + 1000 );
    Vec_IntFill( p->vTtNums, Vec_IntCap(p->vTtNums), -ABC_INFINITY );
}